

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O3

bool __thiscall cppcms::xss::uri_parser::dec_octet(uri_parser *this)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  bool bVar6;
  
  iVar2 = 0;
  if (this->begin_ != this->end_) {
    bVar1 = *this->begin_;
    bVar4 = bVar1 - 0x30;
    uVar3 = 0;
    if (bVar4 < 10) {
      iVar2 = 0;
      uVar5 = 0;
      do {
        uVar3 = uVar5 + 1;
        iVar2 = (uint)bVar1 + iVar2 * 10 + -0x30;
        if (9 < bVar4) break;
        bVar6 = uVar5 < 2;
        uVar5 = uVar3;
      } while (bVar6);
    }
    if ((uVar3 != 0) && (9 < iVar2 || uVar3 == 1)) {
      return iVar2 < 0x100 && (uVar3 == 2 || 99 < iVar2);
    }
  }
  return false;
}

Assistant:

save_point(uri_parser *self) : 
				self_(self) ,
				sp_(self_->begin_)
			{
			}